

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

void IDAAdjFree(void *ida_mem)

{
  void *__ptr;
  void *in_RAX;
  long lVar1;
  void *pvVar2;
  void *local_28;
  
  if (ida_mem == (void *)0x0) {
    return;
  }
  if (*(int *)((long)ida_mem + 0x848) == 0) {
    return;
  }
  __ptr = *(void **)((long)ida_mem + 0x840);
  pvVar2 = __ptr;
  local_28 = in_RAX;
  if (*(long *)((long)__ptr + 0x50) != 0) {
    do {
      IDAAckpntDelete((IDAckpntMem *)((long)__ptr + 0x50));
    } while (*(IDAckpntMem *)((long)__ptr + 0x50) != (IDAckpntMem)0x0);
    pvVar2 = *(void **)((long)ida_mem + 0x840);
    if (pvVar2 == (void *)0x0) goto LAB_00119bc4;
  }
  (**(code **)((long)pvVar2 + 0xa8))(ida_mem);
  if (-1 < *(long *)((long)pvVar2 + 0x68)) {
    lVar1 = -1;
    do {
      free(*(void **)(*(long *)((long)pvVar2 + 0x78) + 8 + lVar1 * 8));
      *(undefined8 *)(*(long *)((long)pvVar2 + 0x78) + 8 + lVar1 * 8) = 0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(long *)((long)pvVar2 + 0x68));
  }
  free(*(void **)((long)pvVar2 + 0x78));
  *(undefined8 *)((long)pvVar2 + 0x78) = 0;
LAB_00119bc4:
  pvVar2 = *(void **)((long)__ptr + 0x30);
  while (pvVar2 != (void *)0x0) {
    *(undefined8 *)((long)__ptr + 0x30) = *(undefined8 *)((long)pvVar2 + 0x80);
    local_28 = *(void **)((long)pvVar2 + 0x10);
    IDAFree(&local_28);
    if (*(code **)((long)pvVar2 + 0x50) != (code *)0x0) {
      (**(code **)((long)pvVar2 + 0x50))(pvVar2);
    }
    if (*(code **)((long)pvVar2 + 0x60) != (code *)0x0) {
      (**(code **)((long)pvVar2 + 0x60))(pvVar2);
    }
    N_VDestroy(*(undefined8 *)((long)pvVar2 + 0x70));
    N_VDestroy(*(undefined8 *)((long)pvVar2 + 0x78));
    free(pvVar2);
    pvVar2 = *(void **)((long)__ptr + 0x30);
  }
  free(__ptr);
  *(undefined8 *)((long)ida_mem + 0x840) = 0;
  return;
}

Assistant:

void IDAAdjFree(void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_adjMallocDone)
  {
    /* Data for adjoint. */
    IDAADJ_mem = IDA_mem->ida_adj_mem;

    /* Delete check points one by one */
    while (IDAADJ_mem->ck_mem != NULL)
    {
      IDAAckpntDelete(&(IDAADJ_mem->ck_mem));
    }

    IDAAdataFree(IDA_mem);

    /* Free all backward problems. */
    while (IDAADJ_mem->IDAB_mem != NULL)
    {
      IDAAbckpbDelete(&(IDAADJ_mem->IDAB_mem));
    }

    /* Free IDAA memory. */
    free(IDAADJ_mem);

    IDA_mem->ida_adj_mem = NULL;
  }
}